

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setActive(SlicePlane *this,bool newVal)

{
  byte bVar1;
  byte in_SIL;
  bool *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  PersistentValue<bool>::operator=
            ((PersistentValue<bool> *)
             (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),in_RDI);
  updateWidgetEnabled((SlicePlane *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setActive(bool newVal) {
  active = newVal;
  updateWidgetEnabled();
  polyscope::requestRedraw();
}